

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

void __thiscall
pbrt::PtexTextureBase::PtexTextureBase
          (PtexTextureBase *this,string *filename,ColorEncodingHandle *encoding)

{
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  string ret;
  String error;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long *plVar3;
  
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filename,pcVar1,pcVar1 + filename->_M_string_length);
  (this->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  (this->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (encoding->
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         ).bits;
  if (cache == (PtexCache *)0x0) {
    cache = Ptex::v2_2::PtexCache::create
                      (100,0x100000000,true,(PtexInputHandler *)0x0,
                       (PtexErrorHandler *)&errorHandler);
  }
  this->valid = false;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  iVar2 = (*cache->_vptr_PtexCache[5])(cache,(filename->_M_dataplus)._M_p,&local_50);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar3 == (long *)0x0) {
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    detail::stringPrintfRecursive<std::__cxx11::string&>(&local_70,"%s",&local_50);
    Error((FileLoc *)0x0,local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    goto LAB_0026bcda;
  }
  iVar2 = (**(code **)(*plVar3 + 0x58))(plVar3);
  if (iVar2 == 1) {
LAB_0026bbd4:
    this->valid = true;
    if (LOGGING_LogLevel < 1) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      detail::stringPrintfRecursive<std::__cxx11::string_const&>
                (&local_70,"%s: added ptex texture",filename);
      Log(Verbose,
          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.cpp"
          ,0x27a,local_70._M_dataplus._M_p);
      goto LAB_0026bcba;
    }
  }
  else {
    iVar2 = (**(code **)(*plVar3 + 0x58))(plVar3);
    if (iVar2 == 3) goto LAB_0026bbd4;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<std::__cxx11::string_const&>
              (&local_70,"%s: only one and three channel ptex textures are supported",filename);
    Error((FileLoc *)0x0,local_70._M_dataplus._M_p);
LAB_0026bcba:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
  }
  (**(code **)(*plVar3 + 0x10))(plVar3);
LAB_0026bcda:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

PtexTextureBase::PtexTextureBase(const std::string &filename,
                                 ColorEncodingHandle encoding)
    : filename(filename), encoding(encoding) {
    if (cache == nullptr) {
        int maxFiles = 100;
        size_t maxMem = 1ull << 32;  // 4GB
        bool premultiply = true;

        cache = Ptex::PtexCache::create(maxFiles, maxMem, premultiply, nullptr,
                                        &errorHandler);
        // TODO? cache->setSearchPath(...);
    }

    // Issue an error if the texture doesn't exist or has an unsupported
    // number of channels.
    valid = false;
    Ptex::String error;
    Ptex::PtexTexture *texture = cache->get(filename.c_str(), error);
    if (texture == nullptr)
        Error("%s", error);
    else {
        if (texture->numChannels() != 1 && texture->numChannels() != 3)
            Error("%s: only one and three channel ptex textures are supported", filename);
        else {
            valid = true;
            LOG_VERBOSE("%s: added ptex texture", filename);
        }
        texture->release();
    }
}